

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O3

Type * __thiscall
spvtools::opt::analysis::TypeManager::RebuildType(TypeManager *this,uint32_t type_id,Type *type)

{
  bool array;
  bool multisample;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t use;
  Dim dimen;
  ImageFormat f;
  StorageClass sc;
  undefined8 uVar3;
  undefined8 *puVar4;
  Type *type_00;
  pointer pvVar5;
  pointer ppTVar6;
  int iVar7;
  Type *pTVar8;
  undefined4 extraout_var;
  const_iterator cVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ForwardPointer *pFVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  _Rb_tree_node_base *p_Var12;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  Struct *pSVar13;
  Struct *pSVar14;
  uint32_t uVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dec;
  undefined8 *puVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dec_1;
  pointer __x_00;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pVar17;
  AccessQualifier qualifier;
  Struct *local_c0;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  param_types;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  subtypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> copy;
  long lVar9;
  
  if (type_id == 0) {
    __assert_fail("type_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x207,
                  "Type *spvtools::opt::analysis::TypeManager::RebuildType(uint32_t, const Type &)")
    ;
  }
  local_c0 = (Struct *)0x0;
  pTVar8 = GetType(this,type_id);
  if (pTVar8 != (Type *)0x0) {
    return pTVar8;
  }
  switch(type->kind_) {
  case kVoid:
  case kBool:
  case kInteger:
  case kFloat:
  case kSampler:
  case kOpaque:
  case kEvent:
  case kDeviceEvent:
  case kReserveId:
  case kQueue:
  case kPipe:
  case kPipeStorage:
  case kNamedBarrier:
  case kAccelerationStructureNV:
  case kRayQueryKHR:
  case kHitObjectNV:
    Type::Clone((Type *)&param_types);
    ppTVar6 = param_types.
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar14 = local_c0;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0 = (Struct *)ppTVar6;
    if ((pSVar14 != (Struct *)0x0) &&
       ((*(pSVar14->super_Type)._vptr_Type[1])(),
       param_types.
       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (*(code *)((*param_types.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->decorations_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)();
    }
    goto LAB_001a868d;
  case kVector:
    iVar7 = (*type->_vptr_Type[0xe])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_00,iVar7) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    uVar15 = *(uint32_t *)(CONCAT44(extraout_var_00,iVar7) + 0x30);
    pSVar13 = (Struct *)operator_new(0x38);
    Vector::Vector((Vector *)pSVar13,pTVar8,uVar15);
    pSVar14 = local_c0;
    local_c0 = pSVar13;
    break;
  case kMatrix:
    iVar7 = (*type->_vptr_Type[0x10])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_04,iVar7) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    uVar15 = *(uint32_t *)(CONCAT44(extraout_var_04,iVar7) + 0x30);
    pSVar13 = (Struct *)operator_new(0x38);
    Matrix::Matrix((Matrix *)pSVar13,pTVar8,uVar15);
    pSVar14 = local_c0;
    local_c0 = pSVar13;
    break;
  case kImage:
    iVar7 = (*type->_vptr_Type[0x12])(type);
    lVar9 = CONCAT44(extraout_var_07,iVar7);
    pTVar8 = *(Type **)(lVar9 + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    dimen = *(Dim *)(lVar9 + 0x30);
    uVar15 = *(uint32_t *)(lVar9 + 0x34);
    array = *(bool *)(lVar9 + 0x38);
    multisample = *(bool *)(lVar9 + 0x39);
    uVar1 = *(uint32_t *)(lVar9 + 0x40);
    f = *(ImageFormat *)(lVar9 + 0x44);
    qualifier = 0x1a856a;
    pSVar13 = (Struct *)operator_new(0x48);
    Image::Image((Image *)pSVar13,pTVar8,dimen,uVar15,array,multisample,uVar1,f,qualifier);
    pSVar14 = local_c0;
    local_c0 = pSVar13;
    goto LAB_001a8713;
  case kSampledImage:
    iVar7 = (*type->_vptr_Type[0x16])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_10,iVar7) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    pSVar13 = (Struct *)operator_new(0x30);
    (pSVar13->super_Type).decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar13->super_Type).decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar13->super_Type).decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar13->super_Type).kind_ = kSampledImage;
    (pSVar13->super_Type)._vptr_Type = (_func_int **)&PTR__Type_003dbd10;
    (pSVar13->element_types_).
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    pSVar14 = local_c0;
    local_c0 = pSVar13;
    break;
  case kArray:
    iVar7 = (*type->_vptr_Type[0x18])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_05,iVar7) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    pSVar13 = (Struct *)operator_new(0x50);
    Array::Array((Array *)pSVar13,pTVar8,(LengthInfo *)(CONCAT44(extraout_var_05,iVar7) + 0x30));
    pSVar14 = local_c0;
    local_c0 = pSVar13;
    break;
  case kRuntimeArray:
    iVar7 = (*type->_vptr_Type[0x1a])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_06,iVar7) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    pSVar13 = (Struct *)operator_new(0x30);
    RuntimeArray::RuntimeArray((RuntimeArray *)pSVar13,pTVar8);
    pSVar14 = local_c0;
    local_c0 = pSVar13;
    break;
  case kStruct:
    iVar7 = (*type->_vptr_Type[0x1c])(type);
    lVar9 = CONCAT44(extraout_var_08,iVar7);
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::reserve(&subtypes,*(long *)(lVar9 + 0x30) - *(long *)(lVar9 + 0x28) >> 3);
    puVar16 = *(undefined8 **)(lVar9 + 0x28);
    puVar4 = *(undefined8 **)(lVar9 + 0x30);
    if (puVar16 != puVar4) {
      do {
        pTVar8 = (Type *)*puVar16;
        param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
        cVar10 = std::
                 _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
        if (cVar10.
            super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          uVar15 = 0;
        }
        else {
          uVar15 = *(uint32_t *)
                    ((long)cVar10.
                           super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                           ._M_cur + 0x10);
        }
        param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar15,pTVar8);
        std::
        vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
        ::emplace_back<spvtools::opt::analysis::Type_const*>
                  ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                    *)&subtypes,(Type **)&param_types);
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar4);
    }
    pSVar14 = (Struct *)operator_new(0x70);
    Struct::Struct(pSVar14,&subtypes);
    if (local_c0 != (Struct *)0x0) {
      pTVar8 = &local_c0->super_Type;
      local_c0 = pSVar14;
      (*pTVar8->_vptr_Type[1])();
      pSVar14 = local_c0;
    }
    local_c0 = pSVar14;
    iVar7 = (*(local_c0->super_Type)._vptr_Type[0x1b])(local_c0);
    p_Var12 = *(_Rb_tree_node_base **)(lVar9 + 0x58);
    if (p_Var12 != (_Rb_tree_node_base *)(lVar9 + 0x48)) {
      do {
        param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(param_types.
                               super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,p_Var12[1]._M_color);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&param_types.
                     super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                 (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&p_Var12[1]._M_parent);
        ppTVar6 = param_types.
                  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (param_types.
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            param_types.
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          uVar15 = (uint32_t)
                   param_types.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                param_types.
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
          do {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&copy,__x);
            Struct::AddMemberDecoration((Struct *)CONCAT44(extraout_var_09,iVar7),uVar15,&copy);
            if (copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)copy.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)copy.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            __x = __x + 1;
          } while (__x != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppTVar6);
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&param_types.
                      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != (_Rb_tree_node_base *)(lVar9 + 0x48));
    }
    if (subtypes.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(subtypes.
                      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)subtypes.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)subtypes.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_001a863d;
  case kPointer:
    iVar7 = (*type->_vptr_Type[0x20])(type);
    pTVar8 = *(Type **)(CONCAT44(extraout_var_11,iVar7) + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    sc = *(StorageClass *)(CONCAT44(extraout_var_11,iVar7) + 0x30);
    pSVar13 = (Struct *)operator_new(0x38);
    Pointer::Pointer((Pointer *)pSVar13,pTVar8,sc);
    pSVar14 = local_c0;
    local_c0 = pSVar13;
    break;
  case kFunction:
    iVar7 = (*type->_vptr_Type[0x22])(type);
    lVar9 = CONCAT44(extraout_var_03,iVar7);
    pTVar8 = *(Type **)(lVar9 + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::reserve(&param_types,*(long *)(lVar9 + 0x38) - *(long *)(lVar9 + 0x30) >> 3);
    puVar16 = *(undefined8 **)(lVar9 + 0x30);
    puVar4 = *(undefined8 **)(lVar9 + 0x38);
    if (puVar16 != puVar4) {
      do {
        type_00 = (Type *)*puVar16;
        subtypes.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)type_00;
        cVar10 = std::
                 _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->type_to_id_)._M_h,(key_type *)&subtypes);
        if (cVar10.
            super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          uVar15 = 0;
        }
        else {
          uVar15 = *(uint32_t *)
                    ((long)cVar10.
                           super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                           ._M_cur + 0x10);
        }
        subtypes.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)RebuildType(this,uVar15,type_00);
        std::
        vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
        ::emplace_back<spvtools::opt::analysis::Type_const*>
                  ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                    *)&param_types,(Type **)&subtypes);
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar4);
    }
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&subtypes);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    pSVar14 = (Struct *)operator_new(0x48);
    Function::Function((Function *)pSVar14,pTVar8,&param_types);
    if (local_c0 != (Struct *)0x0) {
      pTVar8 = &local_c0->super_Type;
      local_c0 = pSVar14;
      (*pTVar8->_vptr_Type[1])();
      pSVar14 = local_c0;
    }
    local_c0 = pSVar14;
    if (param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(param_types.
                      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)param_types.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)param_types.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_001a863d;
  case kForwardPointer:
    iVar7 = (*type->_vptr_Type[0x2e])(type);
    uVar3 = *(undefined8 *)(CONCAT44(extraout_var_01,iVar7) + 0x24);
    local_c0 = (Struct *)operator_new(0x38);
    (local_c0->super_Type).decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_c0->super_Type).decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar15 = 0;
    (local_c0->super_Type).decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_c0->super_Type).kind_ = kForwardPointer;
    (local_c0->super_Type)._vptr_Type = (_func_int **)&PTR__Type_003dc370;
    *(undefined8 *)&(local_c0->super_Type).field_0x24 = uVar3;
    (local_c0->element_types_).
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar8 = *(Type **)(CONCAT44(extraout_var_01,iVar7) + 0x30);
    if (pTVar8 != (Type *)0x0) {
      pFVar11 = ForwardPointer::AsForwardPointer((ForwardPointer *)local_c0);
      param_types.
      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
      cVar10 = std::
               _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
      if (cVar10.
          super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
          ._M_cur != (__node_type *)0x0) {
        uVar15 = *(uint32_t *)
                  ((long)cVar10.
                         super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                         ._M_cur + 0x10);
      }
      pTVar8 = RebuildType(this,uVar15,pTVar8);
      iVar7 = (*pTVar8->_vptr_Type[0x1f])(pTVar8);
      pFVar11->pointer_ = (Pointer *)CONCAT44(extraout_var_02,iVar7);
    }
    goto LAB_001a863d;
  case kCooperativeMatrixNV:
    iVar7 = (*type->_vptr_Type[0x36])(type);
    lVar9 = CONCAT44(extraout_var_12,iVar7);
    pTVar8 = *(Type **)(lVar9 + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    uVar15 = *(uint32_t *)(lVar9 + 0x30);
    uVar1 = *(uint32_t *)(lVar9 + 0x34);
    uVar2 = *(uint32_t *)(lVar9 + 0x38);
    pSVar13 = (Struct *)operator_new(0x40);
    CooperativeMatrixNV::CooperativeMatrixNV
              ((CooperativeMatrixNV *)pSVar13,pTVar8,uVar15,uVar1,uVar2);
    pSVar14 = local_c0;
    local_c0 = pSVar13;
    goto LAB_001a8713;
  case kCooperativeMatrixKHR:
    iVar7 = (*type->_vptr_Type[0x38])(type);
    lVar9 = CONCAT44(extraout_var,iVar7);
    pTVar8 = *(Type **)(lVar9 + 0x28);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
    cVar10 = std::
             _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->type_to_id_)._M_h,(key_type *)&param_types);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(uint32_t *)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                       ._M_cur + 0x10);
    }
    pTVar8 = RebuildType(this,uVar15,pTVar8);
    uVar15 = *(uint32_t *)(lVar9 + 0x30);
    uVar1 = *(uint32_t *)(lVar9 + 0x34);
    uVar2 = *(uint32_t *)(lVar9 + 0x38);
    use = *(uint32_t *)(lVar9 + 0x3c);
    pSVar13 = (Struct *)operator_new(0x40);
    CooperativeMatrixKHR::CooperativeMatrixKHR
              ((CooperativeMatrixKHR *)pSVar13,pTVar8,uVar15,uVar1,uVar2,use);
    pSVar14 = local_c0;
    local_c0 = pSVar13;
LAB_001a8713:
    if (pSVar14 == (Struct *)0x0) goto LAB_001a863d;
    goto LAB_001a8637;
  default:
    __assert_fail("false && \"Unhandled type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x29f,
                  "Type *spvtools::opt::analysis::TypeManager::RebuildType(uint32_t, const Type &)")
    ;
  }
  if (pSVar14 != (Struct *)0x0) {
LAB_001a8637:
    (*(pSVar14->super_Type)._vptr_Type[1])();
  }
LAB_001a863d:
  __x_00 = (type->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (type->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x_00 != pvVar5) {
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&param_types,__x_00);
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)&(local_c0->super_Type).decorations_,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&param_types);
      if (param_types.
          super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(param_types.
                        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)param_types.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)param_types.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      __x_00 = __x_00 + 1;
    } while (__x_00 != pvVar5);
  }
LAB_001a868d:
  param_types.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&this->type_pool_;
  pVar17 = std::
           _Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
           ::
           _M_insert<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,true>>>>
                     ((_Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       *)param_types.
                         super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_c0);
  pTVar8 = *(Type **)((long)pVar17.first.
                            super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                     + 8);
  if (local_c0 != (Struct *)0x0) {
    (*(local_c0->super_Type)._vptr_Type[1])();
  }
  return pTVar8;
}

Assistant:

Type* TypeManager::RebuildType(uint32_t type_id, const Type& type) {
  assert(type_id != 0);

  // The comparison and hash on the type pool will avoid inserting the rebuilt
  // type if an equivalent type already exists. The rebuilt type will be deleted
  // when it goes out of scope at the end of the function in that case. Repeated
  // insertions of the same Type will, at most, keep one corresponding object in
  // the type pool.
  std::unique_ptr<Type> rebuilt_ty;

  // If |type_id| is already present in the type pool, return the existing type.
  // This saves extra work in the type builder and prevents running into
  // circular issues (https://github.com/KhronosGroup/SPIRV-Tools/issues/5623).
  Type* pool_ty = GetType(type_id);
  if (pool_ty != nullptr) {
    return pool_ty;
  }

  switch (type.kind()) {
#define DefineNoSubtypeCase(kind)             \
  case Type::k##kind:                         \
    rebuilt_ty.reset(type.Clone().release()); \
    return type_pool_.insert(std::move(rebuilt_ty)).first->get()

    DefineNoSubtypeCase(Void);
    DefineNoSubtypeCase(Bool);
    DefineNoSubtypeCase(Integer);
    DefineNoSubtypeCase(Float);
    DefineNoSubtypeCase(Sampler);
    DefineNoSubtypeCase(Opaque);
    DefineNoSubtypeCase(Event);
    DefineNoSubtypeCase(DeviceEvent);
    DefineNoSubtypeCase(ReserveId);
    DefineNoSubtypeCase(Queue);
    DefineNoSubtypeCase(Pipe);
    DefineNoSubtypeCase(PipeStorage);
    DefineNoSubtypeCase(NamedBarrier);
    DefineNoSubtypeCase(AccelerationStructureNV);
    DefineNoSubtypeCase(RayQueryKHR);
    DefineNoSubtypeCase(HitObjectNV);
#undef DefineNoSubtypeCase
    case Type::kVector: {
      const Vector* vec_ty = type.AsVector();
      const Type* ele_ty = vec_ty->element_type();
      rebuilt_ty = MakeUnique<Vector>(RebuildType(GetId(ele_ty), *ele_ty),
                                      vec_ty->element_count());
      break;
    }
    case Type::kMatrix: {
      const Matrix* mat_ty = type.AsMatrix();
      const Type* ele_ty = mat_ty->element_type();
      rebuilt_ty = MakeUnique<Matrix>(RebuildType(GetId(ele_ty), *ele_ty),
                                      mat_ty->element_count());
      break;
    }
    case Type::kImage: {
      const Image* image_ty = type.AsImage();
      const Type* ele_ty = image_ty->sampled_type();
      rebuilt_ty = MakeUnique<Image>(
          RebuildType(GetId(ele_ty), *ele_ty), image_ty->dim(),
          image_ty->depth(), image_ty->is_arrayed(),
          image_ty->is_multisampled(), image_ty->sampled(), image_ty->format(),
          image_ty->access_qualifier());
      break;
    }
    case Type::kSampledImage: {
      const SampledImage* image_ty = type.AsSampledImage();
      const Type* ele_ty = image_ty->image_type();
      rebuilt_ty =
          MakeUnique<SampledImage>(RebuildType(GetId(ele_ty), *ele_ty));
      break;
    }
    case Type::kArray: {
      const Array* array_ty = type.AsArray();
      const Type* ele_ty = array_ty->element_type();
      rebuilt_ty = MakeUnique<Array>(RebuildType(GetId(ele_ty), *ele_ty),
                                     array_ty->length_info());
      break;
    }
    case Type::kRuntimeArray: {
      const RuntimeArray* array_ty = type.AsRuntimeArray();
      const Type* ele_ty = array_ty->element_type();
      rebuilt_ty =
          MakeUnique<RuntimeArray>(RebuildType(GetId(ele_ty), *ele_ty));
      break;
    }
    case Type::kStruct: {
      const Struct* struct_ty = type.AsStruct();
      std::vector<const Type*> subtypes;
      subtypes.reserve(struct_ty->element_types().size());
      for (const auto* ele_ty : struct_ty->element_types()) {
        subtypes.push_back(RebuildType(GetId(ele_ty), *ele_ty));
      }
      rebuilt_ty = MakeUnique<Struct>(subtypes);
      Struct* rebuilt_struct = rebuilt_ty->AsStruct();
      for (auto pair : struct_ty->element_decorations()) {
        uint32_t index = pair.first;
        for (const auto& dec : pair.second) {
          // Explicit copy intended.
          std::vector<uint32_t> copy(dec);
          rebuilt_struct->AddMemberDecoration(index, std::move(copy));
        }
      }
      break;
    }
    case Type::kPointer: {
      const Pointer* pointer_ty = type.AsPointer();
      const Type* ele_ty = pointer_ty->pointee_type();
      rebuilt_ty = MakeUnique<Pointer>(RebuildType(GetId(ele_ty), *ele_ty),
                                       pointer_ty->storage_class());
      break;
    }
    case Type::kFunction: {
      const Function* function_ty = type.AsFunction();
      const Type* ret_ty = function_ty->return_type();
      std::vector<const Type*> param_types;
      param_types.reserve(function_ty->param_types().size());
      for (const auto* param_ty : function_ty->param_types()) {
        param_types.push_back(RebuildType(GetId(param_ty), *param_ty));
      }
      rebuilt_ty = MakeUnique<Function>(RebuildType(GetId(ret_ty), *ret_ty),
                                        param_types);
      break;
    }
    case Type::kForwardPointer: {
      const ForwardPointer* forward_ptr_ty = type.AsForwardPointer();
      rebuilt_ty = MakeUnique<ForwardPointer>(forward_ptr_ty->target_id(),
                                              forward_ptr_ty->storage_class());
      const Pointer* target_ptr = forward_ptr_ty->target_pointer();
      if (target_ptr) {
        rebuilt_ty->AsForwardPointer()->SetTargetPointer(
            RebuildType(GetId(target_ptr), *target_ptr)->AsPointer());
      }
      break;
    }
    case Type::kCooperativeMatrixNV: {
      const CooperativeMatrixNV* cm_type = type.AsCooperativeMatrixNV();
      const Type* component_type = cm_type->component_type();
      rebuilt_ty = MakeUnique<CooperativeMatrixNV>(
          RebuildType(GetId(component_type), *component_type),
          cm_type->scope_id(), cm_type->rows_id(), cm_type->columns_id());
      break;
    }
    case Type::kCooperativeMatrixKHR: {
      const CooperativeMatrixKHR* cm_type = type.AsCooperativeMatrixKHR();
      const Type* component_type = cm_type->component_type();
      rebuilt_ty = MakeUnique<CooperativeMatrixKHR>(
          RebuildType(GetId(component_type), *component_type),
          cm_type->scope_id(), cm_type->rows_id(), cm_type->columns_id(),
          cm_type->use_id());
      break;
    }
    default:
      assert(false && "Unhandled type");
      return nullptr;
  }
  for (const auto& dec : type.decorations()) {
    // Explicit copy intended.
    std::vector<uint32_t> copy(dec);
    rebuilt_ty->AddDecoration(std::move(copy));
  }

  return type_pool_.insert(std::move(rebuilt_ty)).first->get();
}